

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::reserve
          (vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_> *this,uint new_capacity)

{
  uint *puVar1;
  undefined8 uVar2;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar3;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar4;
  uint uVar5;
  uint min_new_capacity;
  long lVar6;
  vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_> local_28;
  
  if (new_capacity <= this->m_capacity) {
    if (new_capacity < this->m_capacity) {
      local_28.m_p = (pair<crnlib::vec<16U,_float>,_unsigned_int> *)0x0;
      local_28.m_size = 0;
      local_28.m_capacity = 0;
      if (new_capacity < this->m_size) {
        new_capacity = this->m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_28,new_capacity,false,0x44,object_mover,false);
      if (&local_28 == this) {
        min_new_capacity = local_28.m_size;
      }
      else {
        min_new_capacity = this->m_size;
        if (local_28.m_capacity < min_new_capacity) {
          if (local_28.m_p != (pair<crnlib::vec<16U,_float>,_unsigned_int> *)0x0) {
            crnlib_free(local_28.m_p);
            local_28.m_p = (pair<crnlib::vec<16U,_float>,_unsigned_int> *)0x0;
            local_28.m_size = 0;
            local_28.m_capacity = 0;
            min_new_capacity = this->m_size;
          }
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_28,min_new_capacity,false,0x44,object_mover,false);
          min_new_capacity = this->m_size;
        }
        if (min_new_capacity != 0) {
          ppVar3 = this->m_p;
          ppVar4 = local_28.m_p;
          uVar5 = min_new_capacity;
          do {
            lVar6 = 0;
            do {
              (ppVar4->first).m_s[lVar6] = (ppVar3->first).m_s[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0x10);
            puVar1 = &ppVar3->second;
            ppVar3 = ppVar3 + 1;
            ppVar4->second = *puVar1;
            ppVar4 = ppVar4 + 1;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
      }
      ppVar3 = this->m_p;
      this->m_p = local_28.m_p;
      uVar2._0_4_ = this->m_size;
      uVar2._4_4_ = this->m_capacity;
      this->m_size = min_new_capacity;
      this->m_capacity = local_28.m_capacity;
      if (ppVar3 != (pair<crnlib::vec<16U,_float>,_unsigned_int> *)0x0) {
        local_28.m_p = ppVar3;
        local_28._8_8_ = uVar2;
        crnlib_free(ppVar3);
      }
    }
    return;
  }
  elemental_vector::increase_capacity
            ((elemental_vector *)this,new_capacity,false,0x44,object_mover,false);
  return;
}

Assistant:

inline void reserve(uint new_capacity)
        {
            if (new_capacity > m_capacity)
            {
                increase_capacity(new_capacity, false);
            }
            else if (new_capacity < m_capacity)
            {
                // Must work around the lack of a "decrease_capacity()" method.
                // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
                vector tmp;
                tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
                tmp = *this;
                swap(tmp);
            }
        }